

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  bigint *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int local_34;
  
  uVar3 = lhs1->exp_;
  iVar14 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + uVar3;
  uVar4 = lhs2->exp_;
  iVar15 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + uVar4;
  iVar18 = iVar15;
  if (iVar15 < iVar14) {
    iVar18 = iVar14;
  }
  iVar16 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar5 = rhs->exp_;
  iVar1 = iVar5 + iVar16;
  iVar8 = -1;
  if ((iVar1 <= iVar18 + 1) && (iVar8 = 1, iVar18 <= iVar1)) {
    pbVar9 = lhs1;
    if ((int)uVar4 < (int)uVar3) {
      pbVar9 = lhs2;
    }
    iVar18 = pbVar9->exp_;
    if (iVar5 < iVar18) {
      iVar18 = rhs->exp_;
    }
    uVar13 = 0;
    do {
      iVar2 = iVar5 + iVar16;
      uVar12 = uVar13;
      if (iVar2 <= iVar18) break;
      if (iVar14 < iVar2 || iVar2 <= (int)uVar3) {
        uVar10 = 0;
      }
      else {
        uVar7 = ~uVar3 + iVar5 + iVar16;
        if ((int)uVar7 < 0) goto LAB_002367d9;
        uVar10 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[uVar7];
      }
      if (iVar15 < iVar2 || iVar2 <= (int)uVar4) {
        uVar17 = 0;
      }
      else {
        uVar7 = ~uVar4 + iVar5 + iVar16;
        if ((int)uVar7 < 0) goto LAB_002367d9;
        uVar17 = (ulong)(lhs2->bigits_).super_buffer<unsigned_int>.ptr_[uVar7];
      }
      if (iVar1 < iVar2 || iVar2 <= iVar5) {
        uVar11 = 0;
      }
      else {
        if ((int)(iVar16 - 1U) < 0) {
LAB_002367d9:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                      ,0x13c,"negative value");
        }
        uVar11 = (ulong)(rhs->bigits_).super_buffer<unsigned_int>.ptr_[iVar16 - 1U];
      }
      uVar12 = (uVar11 + uVar13) - (uVar17 + uVar10);
      if (uVar11 + uVar13 < uVar17 + uVar10) {
        local_34 = 1;
        bVar6 = false;
        uVar12 = uVar13;
      }
      else {
        bVar6 = uVar12 < 2;
        if (bVar6) {
          uVar12 = uVar12 << 0x20;
        }
        else {
          local_34 = -1;
        }
      }
      iVar16 = iVar16 + -1;
      uVar13 = uVar12;
    } while (bVar6);
    iVar8 = -(uint)(uVar12 != 0);
    if (iVar18 < iVar2) {
      iVar8 = local_34;
    }
  }
  return iVar8;
}

Assistant:

int add_compare(const bigint& lhs1, const bigint& lhs2,
                         const bigint& rhs) {
    int max_lhs_bigits = (std::max)(lhs1.num_bigits(), lhs2.num_bigits());
    int num_rhs_bigits = rhs.num_bigits();
    if (max_lhs_bigits + 1 < num_rhs_bigits) return -1;
    if (max_lhs_bigits > num_rhs_bigits) return 1;
    auto get_bigit = [](const bigint& n, int i) -> bigit {
      return i >= n.exp_ && i < n.num_bigits() ? n[i - n.exp_] : 0;
    };
    double_bigit borrow = 0;
    int min_exp = (std::min)((std::min)(lhs1.exp_, lhs2.exp_), rhs.exp_);
    for (int i = num_rhs_bigits - 1; i >= min_exp; --i) {
      double_bigit sum =
          static_cast<double_bigit>(get_bigit(lhs1, i)) + get_bigit(lhs2, i);
      bigit rhs_bigit = get_bigit(rhs, i);
      if (sum > rhs_bigit + borrow) return 1;
      borrow = rhs_bigit + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= bigit_bits;
    }
    return borrow != 0 ? -1 : 0;
  }